

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_bolt_message(mg_session *session,mg_message **message)

{
  char cVar1;
  int iVar2;
  int iVar3;
  mg_message_init **message_00;
  mg_session *in_RSI;
  mg_session *in_RDI;
  uint8_t expected_marker;
  int field_number;
  int status;
  mg_message *tmessage;
  int status_2;
  uint8_t signature;
  int status_1;
  uint8_t marker;
  mg_session *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  int local_34;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe4;
  char cVar5;
  
  iVar2 = mg_session_read_uint8(in_stack_ffffffffffffffb8,(uint8_t *)0x10ac0d);
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar3 = mg_session_read_uint8(in_stack_ffffffffffffffb8,(uint8_t *)0x10ac38);
  if (iVar3 != 0) {
    return iVar3;
  }
  message_00 = (mg_message_init **)
               mg_allocator_malloc((mg_allocator *)
                                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                   (size_t)in_stack_ffffffffffffffb8);
  if (message_00 == (mg_message_init **)0x0) {
    mg_session_set_error(in_RDI,"out of memory");
    return -3;
  }
  uVar4 = in_stack_ffffffffffffffdc >> 0x18;
  cVar5 = (char)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  if (uVar4 == 1) {
    if (in_RDI->version == 1) {
      if (cVar5 == -0x4e) {
        *(undefined4 *)message_00 = 3;
        local_34 = mg_session_read_init_message
                             ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),message_00);
joined_r0x0010aeec:
        if (local_34 == 0) {
LAB_0010b031:
          *(mg_message_init ***)in_RSI = message_00;
          return 0;
        }
        goto LAB_0010b063;
      }
    }
    else if (cVar5 == -0x4f) {
      *(undefined4 *)message_00 = 4;
      local_34 = mg_session_read_hello_message
                           ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
                            (mg_message_hello **)message_00);
      goto joined_r0x0010aeec;
    }
  }
  else if (uVar4 == 0xe) {
    if (cVar5 == -0x50) {
      *(undefined4 *)message_00 = 6;
      goto LAB_0010b031;
    }
  }
  else if (uVar4 == 0xf) {
    if (cVar5 == -0x50) {
      *(undefined4 *)message_00 = 7;
      goto LAB_0010b031;
    }
  }
  else if (uVar4 == 0x10) {
    if (cVar5 == (char)((in_RDI->version == 4) + -0x4e)) {
      *(undefined4 *)message_00 = 5;
      local_34 = mg_session_read_run_message
                           (in_RSI,(mg_message_run **)CONCAT44(in_stack_ffffffffffffffe4,iVar2));
      goto joined_r0x0010aeec;
    }
  }
  else if (uVar4 == 0x11) {
    if (cVar5 == -0x4f) {
      *(undefined4 *)message_00 = 9;
      local_34 = mg_session_read_begin_message
                           ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
                            (mg_message_begin **)message_00);
      goto joined_r0x0010aeec;
    }
  }
  else if (uVar4 == 0x12) {
    if (cVar5 == -0x50) {
      *(undefined4 *)message_00 = 10;
      goto LAB_0010b031;
    }
  }
  else if (uVar4 == 0x13) {
    if (cVar5 == -0x50) {
      *(undefined4 *)message_00 = 0xb;
      goto LAB_0010b031;
    }
  }
  else if (uVar4 == 0x3f) {
    cVar1 = (in_RDI->version == 4) + -0x50;
    in_stack_ffffffffffffffc4 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffc4);
    if (cVar5 == cVar1) {
      *(undefined4 *)message_00 = 8;
      local_34 = mg_session_read_pull_message
                           ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
                            (mg_message_pull **)message_00);
      goto joined_r0x0010aeec;
    }
  }
  else if (uVar4 == 0x70) {
    if (cVar5 == -0x4f) {
      *(undefined4 *)message_00 = 1;
      local_34 = mg_session_read_success_message
                           ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
                            (mg_message_success **)message_00);
      goto joined_r0x0010aeec;
    }
  }
  else if (uVar4 == 0x71) {
    if (cVar5 == -0x4f) {
      *(undefined4 *)message_00 = 0;
      local_34 = mg_session_read_record_message
                           ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
                            (mg_message_record **)message_00);
      goto joined_r0x0010aeec;
    }
  }
  else {
    if (uVar4 != 0x7f) {
      mg_session_set_error(in_RDI,"unknown message type");
      local_34 = -10;
      goto LAB_0010b063;
    }
    if (cVar5 == -0x4f) {
      *(undefined4 *)message_00 = 2;
      local_34 = mg_session_read_failure_message
                           ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
                            (mg_message_failure **)message_00);
      goto joined_r0x0010aeec;
    }
  }
  mg_session_set_error(in_RDI,"wrong value marker");
  local_34 = -10;
LAB_0010b063:
  mg_allocator_free((mg_allocator *)CONCAT44(in_stack_ffffffffffffffc4,uVar4),
                    in_stack_ffffffffffffffb8);
  return local_34;
}

Assistant:

int mg_session_read_bolt_message(mg_session *session, mg_message **message) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));

  uint8_t signature;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &signature));

  mg_message *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  switch (signature) {
    case MG_SIGNATURE_MESSAGE_SUCCESS:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_SUCCESS;
      status = mg_session_read_success_message(session, &tmessage->success_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_FAILURE:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_FAILURE;
      status = mg_session_read_failure_message(session, &tmessage->failure_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_RECORD:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RECORD;
      status = mg_session_read_record_message(session, &tmessage->record_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_HELLO:
      if (session->version == 1) {
        if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 2)) {
          goto wrong_marker;
        }
        tmessage->type = MG_MESSAGE_TYPE_INIT;
        status = mg_session_read_init_message(session, &tmessage->init_v);
      } else {
        if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
          goto wrong_marker;
        }
        tmessage->type = MG_MESSAGE_TYPE_HELLO;
        status = mg_session_read_hello_message(session, &tmessage->hello_v);
      }
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_RUN: {
      int field_number = 2 + (session->version == 4);
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + field_number)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RUN;
      status = mg_session_read_run_message(session, &tmessage->run_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    }
    case MG_SIGNATURE_MESSAGE_ACK_FAILURE:
      if (marker != MG_MARKER_TINY_STRUCT) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_ACK_FAILURE;
      break;
    case MG_SIGNATURE_MESSAGE_BEGIN:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_BEGIN;
      status = mg_session_read_begin_message(session, &tmessage->begin_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_COMMIT:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_COMMIT;
      break;
    case MG_SIGNATURE_MESSAGE_ROLLBACK:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_ROLLBACK;
      break;
    case MG_SIGNATURE_MESSAGE_RESET:
      if (marker != MG_MARKER_TINY_STRUCT) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RESET;
      break;
    case MG_SIGNATURE_MESSAGE_PULL: {
      uint8_t expected_marker = MG_MARKER_TINY_STRUCT + (session->version == 4);
      if (marker != expected_marker) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_PULL;
      status = mg_session_read_pull_message(session, &tmessage->pull_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    }
    default:
      mg_session_set_error(session, "unknown message type");
      status = MG_ERROR_PROTOCOL_VIOLATION;
      goto cleanup;
  }

  *message = tmessage;
  return 0;

wrong_marker:
  mg_session_set_error(session, "wrong value marker");
  status = MG_ERROR_PROTOCOL_VIOLATION;
cleanup:
  mg_allocator_free(session->decoder_allocator, tmessage);
  return status;
}